

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::flatten_with_indices<tinyusdz::value::half>
          (GeomPrimvar *this,double t,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *dest,
          TimeSampleInterpolationType tinterp,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  storage_t<unsigned_int> elementSize;
  vector<int,_std::allocator<int>_> indices;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> expanded_val;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> value;
  string local_110;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *local_f0;
  string local_e8;
  undefined1 local_c8 [24];
  undefined1 local_b0 [32];
  bool local_90;
  string local_88;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> local_68;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> local_48;
  
  if (dest == (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0) {
    if (err == (string *)0x0) {
      return false;
    }
    std::__cxx11::string::append((char *)err);
    return false;
  }
  args = err;
  if (((this->_attr)._var._ts._samples.
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       (this->_attr)._var._ts._samples.
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start) && ((this->_attr)._var._blocked == false)) {
    pvVar1 = (this->_attr)._var._value.v_.vtable;
    if ((pvVar1 != (vtable_type *)0x0) && (uVar3 = (*pvVar1->type_id)(), uVar3 == 0)) {
      return false;
    }
    pvVar1 = (this->_attr)._var._value.v_.vtable;
    if ((pvVar1 != (vtable_type *)0x0) && (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)) {
      return false;
    }
  }
  this_00 = &this->_attr;
  uVar3 = Attribute::type_id(this_00);
  bVar2 = IsSupportedGeomPrimvarType(uVar3);
  if (!bVar2) {
    if (err == (string *)0x0) {
      return false;
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"Unsupported type for GeomPrimvar. type = `{}`","");
    Attribute::type_name_abi_cxx11_(&local_e8,this_00);
    fmt::format<std::__cxx11::string>((string *)local_b0,(fmt *)&local_110,&local_e8,args);
    std::__cxx11::string::_M_append((char *)err,local_b0._0_8_);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                               local_e8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) {
      return false;
    }
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    return false;
  }
  local_48.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = Attribute::get<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                    (this_00,t,&local_48,tinterp);
  if (bVar2) {
    elementSize = (storage_t<unsigned_int>)0x1;
    if ((this->_attr)._metas.elementSize.has_value_ != false) {
      elementSize = (this->_attr)._metas.elementSize.contained;
    }
    local_c8._0_8_ = (pointer)0x0;
    local_c8._8_8_ = (pointer)0x0;
    local_c8._16_8_ = (pointer)0x0;
    if (NAN(t)) {
      if ((this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_f0 = &this->_ts_indices;
        if ((this->_ts_indices)._dirty == true) {
          TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::update(local_f0);
        }
        this_01 = local_f0;
        if ((this->_ts_indices)._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->_ts_indices)._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) goto LAB_0018b249;
      }
      else {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)local_c8,&this->_indices);
      }
    }
    else {
      this_01 = &this->_ts_indices;
LAB_0018b249:
      TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::
      get<std::vector<int,_std::allocator<int>_>,_nullptr>
                (this_01,(vector<int,_std::allocator<int>_> *)local_c8,t,tinterp);
    }
    local_68.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
    anon_unknown_0::ExpandWithIndices<tinyusdz::value::half>
              ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b0,&local_48,(uint32_t)elementSize,
               (vector<int,_std::allocator<int>_> *)args_00,&local_68);
    bVar2 = local_90;
    if (local_90 == true) {
      std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::operator=
                (dest,&local_68);
    }
    else if (err != (string *)0x0) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"[Internal Error] Failed to expand for GeomPrimvar type = `{}`"
                 ,"");
      Attribute::type_name_abi_cxx11_(&local_88,this_00);
      fmt::format<std::__cxx11::string>(&local_110,(fmt *)&local_e8,&local_88,args_00);
      std::__cxx11::string::_M_append((char *)err,(ulong)local_110._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                                 local_e8.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (local_b0._8_8_ != 0) {
        std::operator+(&local_110,"\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                      );
        std::__cxx11::string::_M_append((char *)err,(ulong)local_110._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((local_90 == false) && ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if (local_68.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
    }
    if (bVar2 != false) {
      bVar2 = false;
      goto LAB_0018b5cd;
    }
  }
  else if (err != (string *)0x0) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"`{}[]` type requested, but Attribute is type `{}`","");
    local_e8.field_2._M_allocated_capacity._0_4_ = 0x666c6168;
    local_e8._M_string_length = 4;
    local_e8.field_2._M_allocated_capacity._4_4_ =
         local_e8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    Attribute::type_name_abi_cxx11_(&local_88,this_00);
    fmt::format<std::__cxx11::string,std::__cxx11::string>
              ((string *)local_b0,(fmt *)&local_110,&local_e8,&local_88,in_R8);
    std::__cxx11::string::_M_append((char *)err,local_b0._0_8_);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                               local_e8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = true;
LAB_0018b5cd:
  if (local_48.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar2) {
    return false;
  }
  return true;
}

Assistant:

bool GeomPrimvar::flatten_with_indices(const double t, std::vector<T> *dest, const value::TimeSampleInterpolationType tinterp, std::string *err) const {
  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.has_timesamples() || _attr.has_value()) {

    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    std::vector<T> value;
    if (_attr.get_value<std::vector<T>>(t, &value, tinterp)) {

      uint32_t elementSize = _attr.metas().elementSize.value_or(1);

      // Get indices at specified time
      std::vector<int32_t> indices;
      if (value::TimeCode(t).is_default()) {
        if (has_default_indices()) {
          indices = _indices;
        } else if (has_timesampled_indices()) {
          _ts_indices.get(&indices, t, tinterp);
        }
      } else {
        _ts_indices.get(&indices, t, tinterp);
      }

      std::vector<T> expanded_val;
      auto ret = ExpandWithIndices(value, elementSize, indices, &expanded_val);
      if (ret) {
        (*dest) = expanded_val;
        // Currently we ignore ret.value()
        return true;
      } else {
        const std::string &err_msg = ret.error();
        if (err) {
          (*err) += fmt::format(
              "[Internal Error] Failed to expand for GeomPrimvar type = `{}`",
              _attr.type_name());
          if (err_msg.size()) {
            (*err) += "\n" + err_msg;
          }
        }
      }
    } else {
      if (err) {
        (*err) += fmt::format(
            "`{}[]` type requested, but Attribute is type `{}`",
            value::TypeTraits<T>::type_name(), _attr.type_name());
      }
    }
  } else {
    // TODO: Report error?
  }

  return false;
}